

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

void LTFlightData::AppendAllNewPos(void)

{
  atomic_flag aVar1;
  bool bVar2;
  system_error *e;
  exception *e_1;
  unique_lock<std::recursive_mutex> lockFD;
  LTFlightData *fd;
  value_type *fdPair;
  iterator __end1;
  iterator __begin1;
  mapLTFlightDataTy *__range1;
  unique_lock<std::mutex> lock;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  LTFlightData *in_stack_00000210;
  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  *in_stack_fffffffffffffee8;
  unique_lock<std::mutex> *in_stack_fffffffffffffef0;
  unique_lock<std::recursive_mutex> local_a0;
  LTFlightData *local_90;
  reference local_88;
  _Self local_80;
  _Self local_78;
  mapLTFlightDataTy *local_70;
  undefined4 local_68;
  unique_lock<std::mutex> local_50 [2];
  memory_order local_30;
  int local_2c;
  atomic_flag *local_28;
  memory_order local_20;
  int local_1c;
  atomic_flag *local_18;
  undefined4 local_c;
  atomic_flag *local_8;
  
  aVar1.super___atomic_flag_base._M_i = flagNoNewPosToAdd.super___atomic_flag_base._M_i;
  local_8 = &flagNoNewPosToAdd;
  local_c = 5;
  LOCK();
  flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)true;
  UNLOCK();
  if (aVar1.super___atomic_flag_base._M_i == false) {
    std::unique_lock<std::mutex>::unique_lock(local_50,&mapFdMutex);
    bVar2 = std::unique_lock::operator_cast_to_bool((unique_lock<std::mutex> *)0x1dbd91);
    if (bVar2) {
      local_70 = &mapFd;
      local_78._M_node =
           (_Base_ptr)
           std::
           map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
           ::begin(in_stack_fffffffffffffee8);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
           ::end(in_stack_fffffffffffffee8);
      while (bVar2 = std::operator!=(&local_78,&local_80), bVar2) {
        local_88 = std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::
                   operator*((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>
                              *)in_stack_fffffffffffffef0);
        local_90 = &local_88->second;
        std::unique_lock<std::recursive_mutex>::unique_lock
                  (&local_a0,&(local_88->second).dataAccessMutex);
        bVar2 = std::unique_lock::operator_cast_to_bool
                          ((unique_lock<std::recursive_mutex> *)0x1dbef2);
        if (bVar2) {
          bVar2 = IsValid(local_90);
          if (bVar2) {
            AppendNewPos(in_stack_00000210);
          }
        }
        else {
          local_28 = &flagNoNewPosToAdd;
          local_2c = 5;
          local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if ((local_2c != 3) && (local_2c == 5)) {
            LOCK();
            UNLOCK();
          }
          flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffef0);
        std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *)
                   in_stack_fffffffffffffef0);
      }
      local_68 = 0;
    }
    else {
      local_18 = &flagNoNewPosToAdd;
      local_1c = 5;
      local_20 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if ((local_1c != 3) && (local_1c == 5)) {
        LOCK();
        UNLOCK();
      }
      flagNoNewPosToAdd.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
      local_68 = 1;
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void LTFlightData::AppendAllNewPos()
{
    // short-cut if nothing to do
    if (flagNoNewPosToAdd.test_and_set())
        return;

    // somewhere there is something to do
    // need access to flight data map
    try {
        std::unique_lock<std::mutex> lock (mapFdMutex, std::try_to_lock);
        if (!lock) {
            // couldn't get the lock right away
            // -> return, we don't want to hinder rendering
            flagNoNewPosToAdd.clear();      // but need to try again
            return;
        }
        
        // loop all flight data objects and check for new data to analyse
        for (mapLTFlightDataTy::value_type& fdPair: mapFd) {
            LTFlightData& fd = fdPair.second;
            try {
                std::unique_lock<std::recursive_mutex> lockFD (fd.dataAccessMutex, std::try_to_lock);
                if (!lockFD) {
                    flagNoNewPosToAdd.clear();          // need to try it again
                } else {
                    if (fd.IsValid())
                        fd.AppendNewPos();
                }
            } catch (const std::exception& e) {
                LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
                fd.SetInvalid();
            } catch (...) {
                fd.SetInvalid();
            }
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFdMutex", e.what());
        flagNoNewPosToAdd.clear();
    }
}